

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O0

void __thiscall
MT32Emu::Partial::startPartial
          (Partial *this,Part *part,Poly *usePoly,PatchCache *usePatchCache,RhythmTemp *rhythmTemp,
          Partial *pairPartial)

{
  char cVar1;
  byte bVar2;
  TVF *this_00;
  PartialParam *newPartialParam;
  LA32PartialPair *pLVar3;
  bool bVar4;
  bool bVar5;
  Bit32s BVar6;
  uint uVar7;
  Bit32u basePitch;
  PatchTemp *pPVar8;
  Tables *pTVar9;
  char *pcVar10;
  char *pcVar11;
  uint local_58;
  byte local_51;
  LA32PartialPair *local_48;
  LA32PartialPair *useLA32Pair;
  PairType pairType;
  Bit8u panSetting;
  Partial *pairPartial_local;
  RhythmTemp *rhythmTemp_local;
  PatchCache *usePatchCache_local;
  Poly *usePoly_local;
  Part *part_local;
  Partial *this_local;
  
  if ((usePoly == (Poly *)0x0) || (usePatchCache == (PatchCache *)0x0)) {
    pcVar10 = "OK";
    if (usePoly == (Poly *)0x0) {
      pcVar10 = "*** NULL ***";
    }
    pcVar11 = "OK";
    if (usePatchCache == (PatchCache *)0x0) {
      pcVar11 = "*** NULL ***";
    }
    Synth::printDebug(this->synth,
                      "[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s"
                      ,(ulong)(uint)this->partialIndex,(ulong)(uint)this->ownerPart,pcVar10,pcVar11)
    ;
  }
  else {
    this->patchCache = usePatchCache;
    this->poly = usePoly;
    this->mixType = this->patchCache->structureMix;
    this->structurePosition = this->patchCache->structurePosition;
    if (rhythmTemp == (RhythmTemp *)0x0) {
      pPVar8 = Part::getPatchTemp(part);
      local_51 = pPVar8->panpot;
    }
    else {
      local_51 = rhythmTemp->panpot;
    }
    useLA32Pair._7_1_ = local_51;
    if (this->mixType == 3) {
      if (this->structurePosition == 0) {
        cVar1 = PAN_NUMERATOR_MASTER[local_51];
      }
      else {
        cVar1 = PAN_NUMERATOR_SLAVE[local_51];
      }
      useLA32Pair._7_1_ = cVar1 << 1;
      this->mixType = 0;
      _pairType = (Partial *)0x0;
    }
    else {
      bVar4 = Synth::isNicePanningEnabled(this->synth);
      _pairType = pairPartial;
      if (!bVar4) {
        useLA32Pair._7_1_ = local_51 & 0xe;
      }
    }
    if ((this->synth->reversedStereoEnabled & 1U) == 0) {
      local_58 = (uint)useLA32Pair._7_1_;
    }
    else {
      local_58 = 0xe - useLA32Pair._7_1_;
    }
    this->leftPanValue = local_58;
    this->rightPanValue = 0xe - this->leftPanValue;
    if ((this->floatMode & 1U) == 0) {
      BVar6 = getPanFactor(this->leftPanValue);
      this->leftPanValue = BVar6;
      BVar6 = getPanFactor(this->rightPanValue);
      this->rightPanValue = BVar6;
    }
    bVar4 = Synth::isNicePartialMixingEnabled(this->synth);
    if ((!bVar4) && ((this->partialIndex & 4U) != 0)) {
      this->leftPanValue = -this->leftPanValue;
      this->rightPanValue = -this->rightPanValue;
    }
    if ((this->patchCache->PCMPartial & 1U) == 0) {
      this->pcmWave = (PCMWaveEntry *)0x0;
    }
    else {
      this->pcmNum = this->patchCache->pcm;
      if ((0x80 < this->synth->controlROMMap->pcmCount) && (1 < this->patchCache->waveform)) {
        this->pcmNum = this->pcmNum + 0x80;
      }
      this->pcmWave = this->synth->pcmWaves + this->pcmNum;
    }
    uVar7 = Poly::getVelocity(this->poly);
    bVar2 = (this->patchCache->srcPartial).wg.pulseWidthVeloSensitivity;
    pTVar9 = Tables::getInstance();
    this->pulseWidthVal =
         (uVar7 - 0x40) * (bVar2 - 7) +
         (uint)pTVar9->pulseWidth100To255[(this->patchCache->srcPartial).wg.pulseWidth];
    if (this->pulseWidthVal < 0) {
      this->pulseWidthVal = 0;
    }
    else if (0xff < this->pulseWidthVal) {
      this->pulseWidthVal = 0xff;
    }
    this->pair = _pairType;
    this->alreadyOutputed = false;
    TVA::reset(this->tva,part,this->patchCache->partialParam,rhythmTemp);
    TVP::reset(this->tvp,part,this->patchCache->partialParam);
    this_00 = this->tvf;
    newPartialParam = this->patchCache->partialParam;
    basePitch = TVP::getBasePitch(this->tvp);
    TVF::reset(this_00,newPartialParam,basePitch);
    bVar4 = isRingModulatingSlave(this);
    if (bVar4) {
      local_48 = this->pair->la32Pair;
    }
    else {
      pLVar3 = this->la32Pair;
      bVar5 = hasRingModulatingSlave(this);
      (*pLVar3->_vptr_LA32PartialPair[2])(pLVar3,(ulong)bVar5,(ulong)(this->mixType == 1));
      local_48 = this->la32Pair;
    }
    useLA32Pair._0_4_ = (uint)bVar4;
    bVar4 = isPCM(this);
    if (bVar4) {
      (*local_48->_vptr_LA32PartialPair[4])
                (local_48,(ulong)(uint)useLA32Pair,this->synth->pcmROMData + this->pcmWave->addr,
                 (ulong)this->pcmWave->len,(ulong)(this->pcmWave->loop & 1));
    }
    else {
      (*local_48->_vptr_LA32PartialPair[3])
                (local_48,(ulong)(uint)useLA32Pair,(ulong)((this->patchCache->waveform & 1) != 0),
                 (ulong)(this->pulseWidthVal & 0xff),
                 (ulong)(byte)((this->patchCache->srcPartial).tvf.resonance + 1));
    }
    bVar4 = hasRingModulatingSlave(this);
    if (!bVar4) {
      (*this->la32Pair->_vptr_LA32PartialPair[5])(this->la32Pair,1);
    }
  }
  return;
}

Assistant:

void Partial::startPartial(const Part *part, Poly *usePoly, const PatchCache *usePatchCache, const MemParams::RhythmTemp *rhythmTemp, Partial *pairPartial) {
	if (usePoly == NULL || usePatchCache == NULL) {
		synth->printDebug("[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s", partialIndex, ownerPart, usePoly == NULL ? "*** NULL ***" : "OK", usePatchCache == NULL ? "*** NULL ***" : "OK");
		return;
	}
	patchCache = usePatchCache;
	poly = usePoly;
	mixType = patchCache->structureMix;
	structurePosition = patchCache->structurePosition;

	Bit8u panSetting = rhythmTemp != NULL ? rhythmTemp->panpot : part->getPatchTemp()->panpot;
	if (mixType == 3) {
		if (structurePosition == 0) {
			panSetting = PAN_NUMERATOR_MASTER[panSetting] << 1;
		} else {
			panSetting = PAN_NUMERATOR_SLAVE[panSetting] << 1;
		}
		// Do a normal mix independent of any pair partial.
		mixType = 0;
		pairPartial = NULL;
	} else if (!synth->isNicePanningEnabled()) {
		// Mok wanted an option for smoother panning, and we love Mok.
		// CONFIRMED by Mok: exactly bytes like this (right shifted) are sent to the LA32.
		panSetting &= 0x0E;
	}

	leftPanValue = synth->reversedStereoEnabled ? 14 - panSetting : panSetting;
	rightPanValue = 14 - leftPanValue;

	if (!floatMode) {
		leftPanValue = getPanFactor(leftPanValue);
		rightPanValue = getPanFactor(rightPanValue);
	}

	// SEMI-CONFIRMED: From sample analysis:
	// Found that timbres with 3 or 4 partials (i.e. one using two partial pairs) are mixed in two different ways.
	// Either partial pairs are added or subtracted, it depends on how the partial pairs are allocated.
	// It seems that partials are grouped into quarters and if the partial pairs are allocated in different quarters the subtraction happens.
	// Though, this matters little for the majority of timbres, it becomes crucial for timbres which contain several partials that sound very close.
	// In this case that timbre can sound totally different depending on the way it is mixed up.
	// Most easily this effect can be displayed with the help of a special timbre consisting of several identical square wave partials (3 or 4).
	// Say, it is 3-partial timbre. Just play any two notes simultaneously and the polys very probably are mixed differently.
	// Moreover, the partial allocator retains the last partial assignment it did and all the subsequent notes will sound the same as the last released one.
	// The situation is better with 4-partial timbres since then a whole quarter is assigned for each poly. However, if a 3-partial timbre broke the normal
	// whole-quarter assignment or after some partials got aborted, even 4-partial timbres can be found sounding differently.
	// This behaviour is also confirmed with two more special timbres: one with identical sawtooth partials, and one with PCM wave 02.
	// For my personal taste, this behaviour rather enriches the sounding and should be emulated.
	if (!synth->isNicePartialMixingEnabled() && (partialIndex & 4)) {
		leftPanValue = -leftPanValue;
		rightPanValue = -rightPanValue;
	}

	if (patchCache->PCMPartial) {
		pcmNum = patchCache->pcm;
		if (synth->controlROMMap->pcmCount > 128) {
			// CM-32L, etc. support two "banks" of PCMs, selectable by waveform type parameter.
			if (patchCache->waveform > 1) {
				pcmNum += 128;
			}
		}
		pcmWave = &synth->pcmWaves[pcmNum];
	} else {
		pcmWave = NULL;
	}

	// CONFIRMED: pulseWidthVal calculation is based on information from Mok
	pulseWidthVal = (poly->getVelocity() - 64) * (patchCache->srcPartial.wg.pulseWidthVeloSensitivity - 7) + Tables::getInstance().pulseWidth100To255[patchCache->srcPartial.wg.pulseWidth];
	if (pulseWidthVal < 0) {
		pulseWidthVal = 0;
	} else if (pulseWidthVal > 255) {
		pulseWidthVal = 255;
	}

	pair = pairPartial;
	alreadyOutputed = false;
	tva->reset(part, patchCache->partialParam, rhythmTemp);
	tvp->reset(part, patchCache->partialParam);
	tvf->reset(patchCache->partialParam, tvp->getBasePitch());

	LA32PartialPair::PairType pairType;
	LA32PartialPair *useLA32Pair;
	if (isRingModulatingSlave()) {
		pairType = LA32PartialPair::SLAVE;
		useLA32Pair = pair->la32Pair;
	} else {
		pairType = LA32PartialPair::MASTER;
		la32Pair->init(hasRingModulatingSlave(), mixType == 1);
		useLA32Pair = la32Pair;
	}
	if (isPCM()) {
		useLA32Pair->initPCM(pairType, &synth->pcmROMData[pcmWave->addr], pcmWave->len, pcmWave->loop);
	} else {
		useLA32Pair->initSynth(pairType, (patchCache->waveform & 1) != 0, pulseWidthVal, patchCache->srcPartial.tvf.resonance + 1);
	}
	if (!hasRingModulatingSlave()) {
		la32Pair->deactivate(LA32PartialPair::SLAVE);
	}
}